

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

string * __thiscall
compiler::AssemblerCompiler::do_conditional_abi_cxx11_
          (string *__return_storage_ptr__,AssemblerCompiler *this,Conditional *conditional)

{
  unsigned_long __val;
  socklen_t *in_RCX;
  string sStack_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48 [32];
  
  __val = this->label_counter_;
  this->label_counter_ = __val + 2;
  Var::accept_abi_cxx11_((Var *)local_48,(int)conditional->expression,(sockaddr *)this,in_RCX);
  std::operator+(&local_208,"GOTOIF ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::operator+(&local_1e8,&local_208,", ");
  std::__cxx11::to_string(&local_228,__val);
  std::operator+(&local_1c8,&local_1e8,&local_228);
  std::operator+(&local_1a8,&local_1c8,";");
  (**(conditional->right->super_Object)._vptr_Object)(&local_248,conditional->right,this);
  std::operator+(&local_188,&local_1a8,&local_248);
  std::operator+(&local_168,&local_188,"GOTOIF 1, ");
  std::__cxx11::to_string(&local_268,__val + 1);
  std::operator+(&local_148,&local_168,&local_268);
  std::operator+(&local_128,&local_148,";");
  std::operator+(&local_108,&local_128,"LABEL ");
  std::__cxx11::to_string(&local_288,__val);
  std::operator+(&local_e8,&local_108,&local_288);
  std::operator+(&local_c8,&local_e8,";");
  (**(conditional->left->super_Object)._vptr_Object)(&local_2a8,conditional->left,this);
  std::operator+(&local_a8,&local_c8,&local_2a8);
  std::operator+(&local_88,&local_a8,"LABEL ");
  std::__cxx11::to_string(&sStack_2c8,__val + 1);
  std::operator+(&local_68,&local_88,&sStack_2c8);
  std::operator+(__return_storage_ptr__,&local_68,";");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&sStack_2c8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblerCompiler::do_conditional(const Conditional *conditional) {
    auto label_true = label_counter_++;
    auto label_false = label_counter_++;

    return "GOTOIF " + conditional->expression->accept(this) + ", " + std::to_string(label_true) + ";" +
           conditional->right->accept(this) +
           "GOTOIF 1, " + std::to_string(label_false) + ";" +
           "LABEL " + std::to_string(label_true) + ";" +
           conditional->left->accept(this) +
           "LABEL " + std::to_string(label_false) + ";";
}